

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void archive_acl_copy(archive_acl *dest,archive_acl *src)

{
  archive_acl_entry *dest_00;
  mode_t *in_RSI;
  archive_acl *in_RDI;
  archive_acl_entry *ap2;
  archive_acl_entry *ap;
  archive_mstring *in_stack_ffffffffffffffd8;
  archive_acl *in_stack_ffffffffffffffe0;
  undefined8 *puVar1;
  
  archive_acl_clear(in_stack_ffffffffffffffe0);
  in_RDI->mode = *in_RSI;
  for (puVar1 = *(undefined8 **)(in_RSI + 2); puVar1 != (undefined8 *)0x0;
      puVar1 = (undefined8 *)*puVar1) {
    dest_00 = acl_new_entry(in_RDI,(wchar_t)((ulong)in_RSI >> 0x20),(wchar_t)in_RSI,
                            (wchar_t)((ulong)puVar1 >> 0x20),(wchar_t)puVar1);
    if (dest_00 != (archive_acl_entry *)0x0) {
      archive_mstring_copy((archive_mstring *)dest_00,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void
archive_acl_copy(struct archive_acl *dest, struct archive_acl *src)
{
	struct archive_acl_entry *ap, *ap2;

	archive_acl_clear(dest);

	dest->mode = src->mode;
	ap = src->acl_head;
	while (ap != NULL) {
		ap2 = acl_new_entry(dest,
		    ap->type, ap->permset, ap->tag, ap->id);
		if (ap2 != NULL)
			archive_mstring_copy(&ap2->name, &ap->name);
		ap = ap->next;
	}
}